

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall unitString_wrapping_Test::TestBody(unitString_wrapping_Test *this)

{
  bool bVar1;
  uint64_t match_flags;
  char *message;
  double __x;
  double in_XMM1_Qa;
  precise_unit pVar2;
  AssertHelper local_a8;
  Message local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  undefined1 local_68 [8];
  precise_unit fstr;
  unit local_4c;
  unit mol_m3_unit;
  allocator local_31;
  string local_30 [8];
  string mol_m3_str;
  unitString_wrapping_Test *this_local;
  
  mol_m3_str.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"mol/m^3666",&local_31);
  __x = (double)std::allocator<char>::~allocator((allocator<char> *)&local_31);
  units::unit::pow((unit *)&units::m,__x,in_XMM1_Qa);
  local_4c = units::unit::operator/((unit *)&units::mol,(unit *)&fstr.commodity_);
  std::__cxx11::string::string((string *)&gtest_ar.message_,local_30);
  match_flags = units::getDefaultFlags();
  pVar2 = units::unit_from_string((string *)&gtest_ar.message_,match_flags);
  fstr.multiplier_ = pVar2._8_8_;
  local_68 = (undefined1  [8])pVar2.multiplier_;
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  testing::internal::CmpHelperNE<units::precise_unit,units::unit>
            ((internal *)local_98,"fstr","mol_m3_unit",(precise_unit *)local_68,&local_4c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x165,message);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(unitString, wrapping)
{
    std::string const mol_m3_str("mol/m^3666");
    unit const mol_m3_unit(units::mol / units::m.pow(3));
    auto fstr = unit_from_string(mol_m3_str);
    EXPECT_NE(fstr, mol_m3_unit);
}